

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::createUninstantiatedParams
          (ast *this,HierarchyInstantiationSyntax *syntax,ASTContext *context)

{
  SyntaxKind SVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ParamAssignmentSyntax *pPVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  EVP_PKEY_CTX *dst;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar6;
  Expression *local_88;
  iterator __begin3;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)params.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  lVar2 = *(long *)(this + 0x60);
  if (lVar2 != 0) {
    __begin3.index = 0;
    lVar3 = *(long *)(lVar2 + 0x68);
    __begin3.list = (ParentList *)(lVar2 + 0x38);
    for (; (__begin3.list != (ParentList *)(lVar2 + 0x38) || (__begin3.index != lVar3 + 1U >> 1));
        __begin3.index = __begin3.index + 1) {
      pPVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
               iterator_base<slang::syntax::ParamAssignmentSyntax_*>::dereference(&__begin3);
      SVar1 = (pPVar5->super_SyntaxNode).kind;
      context = extraout_RDX;
      if (SVar1 == NamedParamAssignment) {
        if (*(long *)&pPVar5[3].super_SyntaxNode != 0) {
          iVar4 = Expression::bind((int)*(long *)&pPVar5[3].super_SyntaxNode,(sockaddr *)syntax,4);
          local_88 = (Expression *)CONCAT44(extraout_var_00,iVar4);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&params,&local_88);
          context = extraout_RDX_01;
        }
      }
      else if (SVar1 == OrderedParamAssignment) {
        iVar4 = Expression::bind((int)*(undefined8 *)&pPVar5[1].super_SyntaxNode,(sockaddr *)syntax,
                                 0);
        local_88 = (Expression *)CONCAT44(extraout_var,iVar4);
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&params,&local_88);
        context = extraout_RDX_00;
      }
    }
  }
  dst = (EVP_PKEY_CTX *)**(undefined8 **)&(syntax->super_MemberSyntax).super_SyntaxNode;
  sVar6._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (&params.super_SmallVectorBase<const_slang::ast::Expression_*>,dst,
                  (EVP_PKEY_CTX *)context);
  sVar6._M_ptr._4_4_ = extraout_var_01;
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&params.super_SmallVectorBase<const_slang::ast::Expression_*>,dst);
  sVar6._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
  return sVar6;
}

Assistant:

static std::span<const Expression* const> createUninstantiatedParams(
    const HierarchyInstantiationSyntax& syntax, const ASTContext& context) {

    SmallVector<const Expression*> params;
    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment) {
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            }
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    return params.copy(context.getCompilation());
}